

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

int __thiscall
PatternBlock::clone(PatternBlock *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int4 iVar1;
  PatternBlock *this_00;
  
  this_00 = (PatternBlock *)operator_new(0x38);
  PatternBlock(this_00,true);
  iVar1 = this->nonzerosize;
  this_00->offset = this->offset;
  this_00->nonzerosize = iVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this_00->maskvec,&this->maskvec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this_00->valvec,&this->valvec);
  return (int)this_00;
}

Assistant:

PatternBlock *PatternBlock::clone(void) const

{
  PatternBlock *res = new PatternBlock(true);

  res->offset = offset;
  res->nonzerosize = nonzerosize;
  res->maskvec = maskvec;
  res->valvec = valvec;
  return res;
}